

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::InstanceOfAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<2UL> *pJVar1;
  Var aValue;
  RecyclableObject *pRVar2;
  undefined1 *aValue_00;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)46>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar1->VarArray[0]);
  if (aValue != (Var)0x0) {
    if ((ulong)aValue >> 0x30 == 0) {
      pRVar2 = Js::VarTo<Js::RecyclableObject>(aValue);
      if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
      }
    }
    aValue_00 = (undefined1 *)InflateVarInReplay(executeContext,pJVar1->VarArray[1]);
    if (aValue_00 != (undefined1 *)0x0) {
      if (aValue_00 < &DAT_1000000000000) {
        pRVar2 = Js::VarTo<Js::RecyclableObject>(aValue_00);
        if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          aValue_00 = (undefined1 *)Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
        }
      }
      Js::JavascriptOperators::OP_IsInst(aValue,aValue_00,scriptContext,(IsInstInlineCache *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void InstanceOfAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::InstanceOfActionTag>(evt);
            Js::Var object = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(object, ctx);
            Js::Var constructor = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(constructor, ctx);

            // Result is not needed but trigger computation for any effects
            Js::JavascriptOperators::OP_IsInst(object, constructor, ctx, nullptr);
        }